

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

natwm_error
string_get_delimiter(char *string,char delimiter,char **destination,size_t *length,_Bool consume)

{
  char cVar1;
  natwm_error nVar2;
  long lVar3;
  
  if (string == (char *)0x0) {
    nVar2 = INVALID_INPUT_ERROR;
  }
  else {
    lVar3 = 0;
    do {
      cVar1 = string[lVar3];
      lVar3 = lVar3 + 1;
      if (cVar1 == '\0') break;
    } while (cVar1 != delimiter);
    if (cVar1 != '\0') {
      nVar2 = string_splice(string,0,((ulong)consume + lVar3) - 1,destination,length);
      return nVar2;
    }
    nVar2 = NOT_FOUND_ERROR;
  }
  return nVar2;
}

Assistant:

enum natwm_error string_get_delimiter(const char *string, char delimiter, char **destination,
                                      size_t *length, bool consume)
{
        size_t index = 0;
        enum natwm_error find_err = string_find_char(string, delimiter, &index);

        if (find_err != NO_ERROR) {
                return find_err;
        }

        if (consume) {
                ++index;
        }

        enum natwm_error splice_err = string_splice(string, 0, index, destination, length);

        if (splice_err != NO_ERROR) {
                return splice_err;
        }

        return NO_ERROR;
}